

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_ntlm.c
# Opt level: O3

char * printable(char *inbuf,size_t inlength)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  size_t __size;
  ulong uVar8;
  
  sVar2 = strlen(inbuf);
  if (sVar2 == 0) {
    pcVar3 = (char *)malloc(10);
    if (pcVar3 != (char *)0x0) {
      curl_msnprintf(pcVar3,10,"%s","[NOTHING]");
      return pcVar3;
    }
  }
  else {
    uVar6 = 7;
    if (7 < sVar2 >> 1) {
      uVar6 = sVar2 >> 1;
    }
    __size = uVar6 + sVar2;
    pcVar3 = (char *)malloc(__size);
    if (pcVar3 != (char *)0x0) {
      uVar8 = 0;
      sVar7 = 0;
      do {
        pcVar4 = pcVar3;
        if (__size - 7 < uVar8) {
          __size = __size + uVar6;
          pcVar4 = (char *)realloc(pcVar3,__size);
          if (pcVar4 == (char *)0x0) {
            free(pcVar3);
            return (char *)0x0;
          }
        }
        pcVar3 = pcVar4;
        cVar1 = inbuf[sVar7];
        if ((byte)(cVar1 + 0x81U) < 0xa2) {
          curl_msnprintf(pcVar3 + uVar8,__size - uVar8,"[0x%02X]",(ulong)(uint)(int)cVar1);
          lVar5 = 6;
        }
        else {
          pcVar3[uVar8] = cVar1;
          lVar5 = 1;
        }
        uVar8 = uVar8 + lVar5;
        sVar7 = sVar7 + 1;
      } while (sVar2 != sVar7);
      pcVar3[uVar8] = '\0';
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *printable(char *inbuf, size_t inlength)
{
  char *outbuf;
  char *newbuf;
  size_t newsize;
  size_t outsize;
  size_t outincr = 0;
  size_t i, o = 0;

#define HEX_FMT_STR  "[0x%02X]"
#define HEX_STR_LEN  6
#define NOTHING_STR  "[NOTHING]"
#define NOTHING_LEN  9

  if(!inlength)
    inlength = strlen(inbuf);

  if(inlength) {
    outincr = ((inlength/2) < (HEX_STR_LEN + 1)) ?
      HEX_STR_LEN + 1 : inlength/2;
    outsize = inlength + outincr;
  }
  else
    outsize = NOTHING_LEN + 1;

  outbuf = malloc(outsize);
  if(!outbuf)
    return NULL;

  if(!inlength) {
    snprintf(&outbuf[0], outsize, "%s", NOTHING_STR);
    return outbuf;
  }

  for(i = 0; i<inlength; i++) {

    if(o > outsize - (HEX_STR_LEN + 1)) {
      newsize = outsize + outincr;
      newbuf = realloc(outbuf, newsize);
      if(!newbuf) {
        free(outbuf);
        return NULL;
      }
      outbuf = newbuf;
      outsize = newsize;
    }

    if((inbuf[i] > 0x20) && (inbuf[i] < 0x7F)) {
      outbuf[o] = inbuf[i];
      o++;
    }
    else {
      snprintf(&outbuf[o], outsize - o, HEX_FMT_STR, inbuf[i]);
      o += HEX_STR_LEN;
    }

  }
  outbuf[o] = '\0';

  return outbuf;
}